

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseMessageSetItemTmpl<google::protobuf::MessageLite,google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,char *ptr,MessageLite *containing_type,
          InternalMetadataWithArenaLite *metadata,ParseContext *ctx)

{
  char *ptr_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  MessageLite *pMVar6;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  ParseContext *s;
  char *pcVar9;
  StringPiece val;
  char *ptr_local;
  bool was_packed_on_wire;
  uint32 tag;
  MessageLite *local_f8;
  char *p;
  uint64 tmp;
  string payload;
  ExtensionInfo extension;
  ParseContext tmp_ctx;
  
  payload._M_dataplus._M_p = (pointer)&payload.field_2;
  payload._M_string_length = 0;
  payload.field_2._M_local_buf[0] = '\0';
  ptr_local = ptr;
  local_f8 = containing_type;
LAB_002942ea:
  uVar8 = 0;
LAB_002942ec:
  bVar3 = ParseContext::Done(ctx,&ptr_local);
  pcVar9 = ptr_local;
  if (bVar3) goto LAB_002944f3;
  ptr_00 = ptr_local + 1;
  tag = (uint32)(byte)*ptr_local;
  if (tag == 0x1a) {
    if (uVar8 == 0) {
      ptr_local = ptr_00;
      uVar4 = ReadSize(&ptr_local);
      if (ptr_local == (char *)0x0) goto LAB_002944e2;
      ptr_local = EpsCopyInputStream::ReadString
                            (&ctx->super_EpsCopyInputStream,ptr_local,uVar4,&payload);
    }
    else {
      ptr_local = ptr_00;
      ptr_local = ParseField(this,(ulong)uVar8 * 8 + 2,ptr_00,local_f8,metadata,ctx);
    }
    uVar8 = 0;
LAB_0029443e:
    if (ptr_local != (char *)0x0) goto LAB_002942ec;
  }
  else {
    if (*ptr_local != 0x10) {
      ptr_local = ptr_00;
      ptr_local = ReadTag(pcVar9,&tag,0);
      if (((ulong)tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        pcVar9 = ptr_local;
        goto LAB_002944f3;
      }
      ptr_local = ParseField(this,(ulong)tag,ptr_local,local_f8,metadata,ctx);
      goto LAB_0029443e;
    }
    ptr_local = ptr_00;
    ptr_local = ParseBigVarint(ptr_00,&tmp);
    uVar4 = (uint32)tmp;
    if (ptr_local == (char *)0x0) goto LAB_002944e2;
    uVar8 = (uint32)tmp;
    if (payload._M_string_length == 0) goto LAB_002942ec;
    s = ctx;
    bVar3 = FindExtension(this,2,(uint32)tmp,local_f8,ctx,&extension,&was_packed_on_wire);
    sVar2 = payload._M_string_length;
    _Var1 = payload._M_dataplus;
    if (!bVar3) goto LAB_002944ad;
    if (extension.is_repeated == true) {
      pMVar6 = AddMessage(this,uVar4,'\v',(MessageLite *)extension.field_3.enum_validity_check.func,
                          extension.descriptor);
    }
    else {
      pMVar6 = MutableMessage(this,uVar4,'\v',
                              (MessageLite *)extension.field_3.enum_validity_check.func,
                              extension.descriptor);
    }
    ParseContext::ParseContext<std::__cxx11::string&>(&tmp_ctx,ctx->depth_,false,&p,&payload);
    tmp_ctx.data_.pool._0_4_ = *(undefined4 *)&(ctx->data_).pool;
    tmp_ctx.data_.pool._4_4_ = *(undefined4 *)((long)&(ctx->data_).pool + 4);
    tmp_ctx.data_.factory._0_4_ = *(undefined4 *)&(ctx->data_).factory;
    tmp_ctx.data_.factory._4_4_ = *(undefined4 *)((long)&(ctx->data_).factory + 4);
    iVar5 = (*pMVar6->_vptr_MessageLite[0xd])(pMVar6,p,&tmp_ctx);
    if ((CONCAT44(extraout_var,iVar5) != 0) &&
       (uVar8 = 0, tmp_ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) goto LAB_002942ec;
  }
LAB_002944e2:
  pcVar9 = (char *)0x0;
LAB_002944f3:
  std::__cxx11::string::~string((string *)&payload);
  return pcVar9;
LAB_002944ad:
  if ((*(ulong *)metadata & 1) == 0) {
    pbVar7 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ::mutable_unknown_fields_slow
                       ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                         *)metadata);
  }
  else {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)metadata & 0xfffffffffffffffe);
  }
  val.length_ = (stringpiece_ssize_type)pbVar7;
  val.ptr_ = (char *)sVar2;
  WriteLengthDelimited((internal *)(ulong)uVar4,(uint32)_Var1._M_p,val,(string *)s);
  goto LAB_002942ea;
}

Assistant:

const char* ExtensionSet::ParseMessageSetItemTmpl(const char* ptr,
                                                  const Msg* containing_type,
                                                  Metadata* metadata,
                                                  internal::ParseContext* ctx) {
  std::string payload;
  uint32 type_id = 0;
  while (!ctx->Done(&ptr)) {
    uint32 tag = static_cast<uint8>(*ptr++);
    if (tag == WireFormatLite::kMessageSetTypeIdTag) {
      uint64 tmp;
      ptr = ParseBigVarint(ptr, &tmp);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      type_id = tmp;
      if (!payload.empty()) {
        ExtensionInfo extension;
        bool was_packed_on_wire;
        if (!FindExtension(2, type_id, containing_type, ctx, &extension,
                           &was_packed_on_wire)) {
          WriteLengthDelimited(type_id, payload,
                               metadata->mutable_unknown_fields());
        } else {
          MessageLite* value =
              extension.is_repeated
                  ? AddMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                               *extension.message_info.prototype,
                               extension.descriptor)
                  : MutableMessage(type_id, WireFormatLite::TYPE_MESSAGE,
                                   *extension.message_info.prototype,
                                   extension.descriptor);

          const char* p;
          // We can't use regular parse from string as we have to track
          // proper recursion depth and descriptor pools.
          ParseContext tmp_ctx(ctx->depth(), false, &p, payload);
          tmp_ctx.data().pool = ctx->data().pool;
          tmp_ctx.data().factory = ctx->data().factory;
          GOOGLE_PROTOBUF_PARSER_ASSERT(value->_InternalParse(p, &tmp_ctx) &&
                                         tmp_ctx.EndedAtLimit());
        }
        type_id = 0;
      }
    } else if (tag == WireFormatLite::kMessageSetMessageTag) {
      if (type_id != 0) {
        ptr = ParseFieldMaybeLazily(static_cast<uint64>(type_id) * 8 + 2, ptr,
                                    containing_type, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
        type_id = 0;
      } else {
        int32 size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        ptr = ctx->ReadString(ptr, size, &payload);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    } else {
      ptr = ReadTag(ptr - 1, &tag);
      if (tag == 0 || (tag & 7) == 4) {
        ctx->SetLastTag(tag);
        return ptr;
      }
      ptr = ParseField(tag, ptr, containing_type, metadata, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
  }
  return ptr;
}